

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::CommandLineInterface::PrintFreeFieldNumbers
          (CommandLineInterface *this,Descriptor *descriptor)

{
  btree_node<absl::lts_20250127::container_internal::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>
  bVar1;
  CompressedTuple<absl::lts_20250127::container_internal::key_compare_adapter<std::less<std::pair<int,_int>_>,_std::pair<int,_int>_>::checked_compare,_std::allocator<std::pair<int,_int>_>,_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>_*>
  CVar2;
  CommandLineInterface *this_00;
  bool bVar3;
  int iVar4;
  reference ppVar5;
  ostream *poVar6;
  long lVar7;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  UntypedFormatSpecImpl format;
  const_iterator other;
  UntypedFormatSpecImpl format_00;
  UntypedFormatSpecImpl format_01;
  UntypedFormatSpecImpl format_02;
  Span<const_absl::lts_20250127::str_format_internal::FormatArgImpl> args;
  Span<const_absl::lts_20250127::str_format_internal::FormatArgImpl> args_00;
  Span<const_absl::lts_20250127::str_format_internal::FormatArgImpl> args_01;
  Span<const_absl::lts_20250127::str_format_internal::FormatArgImpl> args_02;
  const_iterator cVar11;
  string output;
  vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
  nested_messages;
  btree_set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
  ranges;
  string local_c8;
  Descriptor **local_a8;
  iterator iStack_a0;
  Descriptor **local_98;
  Data local_90;
  code *local_88;
  ulong local_80;
  code *local_78;
  btree<absl::lts_20250127::container_internal::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>
  local_70;
  CommandLineInterface *local_58;
  btree_iterator<const_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>,_const_std::pair<int,_int>_&,_const_std::pair<int,_int>_*>
  local_50;
  ulong local_40;
  char *local_38;
  
  local_70.root_ =
       (node_type *)
       absl::lts_20250127::container_internal::
       btree<absl::lts_20250127::container_internal::set_params<std::pair<int,int>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>,256,false>>
       ::EmptyNode()::empty_node;
  local_70.rightmost_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::key_compare_adapter<std::less<std::pair<int,_int>_>,_std::pair<int,_int>_>::checked_compare,_std::allocator<std::pair<int,_int>_>,_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>_*>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>,_true>
  .
  super_Storage<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>_*,_2UL,_false>
  .value = (CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::key_compare_adapter<std::less<std::pair<int,_int>_>,_std::pair<int,_int>_>::checked_compare,_std::allocator<std::pair<int,_int>_>,_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>_*>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>,_true>
            )absl::lts_20250127::container_internal::
             btree<absl::lts_20250127::container_internal::set_params<std::pair<int,int>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>,256,false>>
             ::EmptyNode()::empty_node;
  local_70.size_ = 0;
  local_98 = (Descriptor **)0x0;
  local_a8 = (Descriptor **)0x0;
  iStack_a0._M_current = (Descriptor **)0x0;
  local_58 = this;
  if (0 < descriptor->field_count_) {
    lVar7 = 4;
    lVar9 = 0;
    do {
      local_c8._M_dataplus._M_p._0_4_ = *(int *)(&descriptor->fields_->super_SymbolBase + lVar7);
      local_c8._M_dataplus._M_p._4_4_ = (int)local_c8._M_dataplus._M_p + 1;
      absl::lts_20250127::container_internal::
      btree<absl::lts_20250127::container_internal::set_params<std::pair<int,int>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>,256,false>>
      ::insert_unique<std::pair<int,int>,std::pair<int,int>>
                ((pair<absl::lts_20250127::container_internal::btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>,_const_std::pair<int,_int>_&,_const_std::pair<int,_int>_*>,_bool>
                  *)&local_90,
                 (btree<absl::lts_20250127::container_internal::set_params<std::pair<int,int>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>,256,false>>
                  *)&local_70,(pair<int,_int> *)&local_c8,(pair<int,_int> *)&local_c8);
      lVar9 = lVar9 + 1;
      lVar7 = lVar7 + 0x58;
    } while (lVar9 < descriptor->field_count_);
  }
  if (0 < descriptor->extension_range_count_) {
    lVar9 = 0;
    lVar7 = 0;
    do {
      local_c8._M_dataplus._M_p = *(pointer *)((long)&descriptor->extension_ranges_->start_ + lVar9)
      ;
      absl::lts_20250127::container_internal::
      btree<absl::lts_20250127::container_internal::set_params<std::pair<int,int>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>,256,false>>
      ::insert_unique<std::pair<int,int>,std::pair<int,int>>
                ((pair<absl::lts_20250127::container_internal::btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>,_const_std::pair<int,_int>_&,_const_std::pair<int,_int>_*>,_bool>
                  *)&local_90,
                 (btree<absl::lts_20250127::container_internal::set_params<std::pair<int,int>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>,256,false>>
                  *)&local_70,(pair<int,_int> *)&local_c8,(pair<int,_int> *)&local_c8);
      lVar7 = lVar7 + 1;
      lVar9 = lVar9 + 0x28;
    } while (lVar7 < descriptor->extension_range_count_);
  }
  if (0 < descriptor->reserved_range_count_) {
    lVar7 = 0;
    do {
      local_c8._M_dataplus._M_p._4_4_ = descriptor->reserved_ranges_[lVar7].end;
      local_c8._M_dataplus._M_p._0_4_ = descriptor->reserved_ranges_[lVar7].start;
      absl::lts_20250127::container_internal::
      btree<absl::lts_20250127::container_internal::set_params<std::pair<int,int>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>,256,false>>
      ::insert_unique<std::pair<int,int>,std::pair<int,int>>
                ((pair<absl::lts_20250127::container_internal::btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>,_const_std::pair<int,_int>_&,_const_std::pair<int,_int>_*>,_bool>
                  *)&local_90,
                 (btree<absl::lts_20250127::container_internal::set_params<std::pair<int,int>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>,256,false>>
                  *)&local_70,(pair<int,_int> *)&local_c8,(pair<int,_int> *)&local_c8);
      lVar7 = lVar7 + 1;
    } while (lVar7 < descriptor->reserved_range_count_);
  }
  iVar4 = descriptor->nested_type_count_;
  if (0 < iVar4) {
    lVar9 = 0;
    lVar7 = 0;
    do {
      local_90.ptr = &descriptor->nested_types_->super_SymbolBase + lVar9;
      if (iStack_a0._M_current == local_98) {
        std::
        vector<google::protobuf::Descriptor_const*,std::allocator<google::protobuf::Descriptor_const*>>
        ::_M_realloc_insert<google::protobuf::Descriptor_const*const&>
                  ((vector<google::protobuf::Descriptor_const*,std::allocator<google::protobuf::Descriptor_const*>>
                    *)&local_a8,iStack_a0,(Descriptor **)&local_90.ptr);
        iVar4 = descriptor->nested_type_count_;
      }
      else {
        *iStack_a0._M_current = (Descriptor *)local_90;
        iStack_a0._M_current = iStack_a0._M_current + 1;
      }
      lVar7 = lVar7 + 1;
      lVar9 = lVar9 + 0xa0;
    } while (lVar7 < iVar4);
  }
  this_00 = local_58;
  if (iStack_a0._M_current != local_a8) {
    uVar10 = 0;
    do {
      PrintFreeFieldNumbers(this_00,local_a8[uVar10]);
      uVar10 = uVar10 + 1;
    } while (uVar10 < (ulong)((long)iStack_a0._M_current - (long)local_a8 >> 3));
  }
  local_38 = (descriptor->all_names_).payload_;
  local_40 = (ulong)*(ushort *)(local_38 + 2);
  local_90.ptr = &local_40;
  local_38 = local_38 + ~local_40;
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  local_c8._M_string_length = 0;
  local_c8.field_2._M_local_buf[0] = '\0';
  local_88 = absl::lts_20250127::str_format_internal::FormatArgImpl::
             Dispatch<std::basic_string_view<char,std::char_traits<char>>>;
  format.size_ = 0xb;
  format.data_ = "%-35s free:";
  args.len_ = 1;
  args.ptr_ = (pointer)&local_90;
  absl::lts_20250127::str_format_internal::AppendPack(&local_c8,format,args);
  cVar11 = absl::lts_20250127::container_internal::
           btree<absl::lts_20250127::container_internal::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>
           ::begin(&local_70);
  CVar2.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::key_compare_adapter<std::less<std::pair<int,_int>_>,_std::pair<int,_int>_>::checked_compare,_std::allocator<std::pair<int,_int>_>,_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>_*>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>,_true>
  .
  super_Storage<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>_*,_2UL,_false>
  .value = local_70.rightmost_.
           super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::key_compare_adapter<std::less<std::pair<int,_int>_>,_std::pair<int,_int>_>::checked_compare,_std::allocator<std::pair<int,_int>_>,_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>_*>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>,_true>
           .
           super_Storage<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>_*,_2UL,_false>
           .value;
  local_50.node_ = cVar11.node_;
  local_50.position_ = cVar11.position_;
  if (((ulong)local_70.rightmost_.
              super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::key_compare_adapter<std::less<std::pair<int,_int>_>,_std::pair<int,_int>_>::checked_compare,_std::allocator<std::pair<int,_int>_>,_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>_*>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>,_true>
              .
              super_Storage<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>_*,_2UL,_false>
              .value & 7) == 0) {
    bVar1 = *(btree_node<absl::lts_20250127::container_internal::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>
              *)((long)local_70.rightmost_.
                       super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::key_compare_adapter<std::less<std::pair<int,_int>_>,_std::pair<int,_int>_>::checked_compare,_std::allocator<std::pair<int,_int>_>,_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>_*>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>,_true>
                       .
                       super_Storage<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>_*,_2UL,_false>
                       .value + 10);
    uVar8 = 1;
    while( true ) {
      other.position_._0_1_ = bVar1;
      other.node_ = (btree_node<absl::lts_20250127::container_internal::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>
                     *)CVar2.
                       super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::key_compare_adapter<std::less<std::pair<int,_int>_>,_std::pair<int,_int>_>::checked_compare,_std::allocator<std::pair<int,_int>_>,_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>_*>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>,_true>
                       .
                       super_Storage<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>_*,_2UL,_false>
                       .value;
      other._9_7_ = 0;
      bVar3 = absl::lts_20250127::container_internal::
              btree_iterator<const_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>,_const_std::pair<int,_int>_&,_const_std::pair<int,_int>_*>
              ::Equals(&local_50,other);
      if (bVar3) break;
      ppVar5 = absl::lts_20250127::container_internal::
               btree_iterator<const_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>,_const_std::pair<int,_int>_&,_const_std::pair<int,_int>_*>
               ::operator*(&local_50);
      if ((int)uVar8 < ppVar5->second) {
        iVar4 = ppVar5->first;
        if ((int)uVar8 < iVar4) {
          local_90._4_4_ = 0;
          local_90._0_4_ = uVar8;
          if (uVar8 + 1 == iVar4) {
            local_88 = absl::lts_20250127::str_format_internal::FormatArgImpl::Dispatch<int>;
            format_00.size_ = 3;
            format_00.data_ = " %d";
            args_00.len_ = 1;
            args_00.ptr_ = (pointer)&local_90;
            absl::lts_20250127::str_format_internal::AppendPack(&local_c8,format_00,args_00);
          }
          else {
            local_80 = (ulong)(iVar4 - 1);
            local_88 = absl::lts_20250127::str_format_internal::FormatArgImpl::Dispatch<int>;
            local_78 = absl::lts_20250127::str_format_internal::FormatArgImpl::Dispatch<int>;
            format_01.size_ = 6;
            format_01.data_ = " %d-%d";
            args_01.len_ = 2;
            args_01.ptr_ = (pointer)&local_90;
            absl::lts_20250127::str_format_internal::AppendPack(&local_c8,format_01,args_01);
          }
        }
        uVar8 = ppVar5->second;
      }
      absl::lts_20250127::container_internal::
      btree_iterator<const_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>,_const_std::pair<int,_int>_&,_const_std::pair<int,_int>_*>
      ::increment(&local_50);
    }
    if ((int)uVar8 < 0x20000000) {
      local_90._4_4_ = 0;
      local_90._0_4_ = uVar8;
      local_88 = absl::lts_20250127::str_format_internal::FormatArgImpl::Dispatch<int>;
      format_02.size_ = 7;
      format_02.data_ = " %d-INF";
      args_02.len_ = 1;
      args_02.ptr_ = (pointer)&local_90;
      absl::lts_20250127::str_format_internal::AppendPack(&local_c8,format_02,args_02);
    }
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,local_c8._M_dataplus._M_p,local_c8._M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p,
                      CONCAT71(local_c8.field_2._M_allocated_capacity._1_7_,
                               local_c8.field_2._M_local_buf[0]) + 1);
    }
    if (local_a8 != (Descriptor **)0x0) {
      operator_delete(local_a8,(long)local_98 - (long)local_a8);
    }
    absl::lts_20250127::container_internal::
    btree<absl::lts_20250127::container_internal::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>
    ::~btree(&local_70);
    return;
  }
  __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/layout.h"
                ,0x1fe,
                "CopyConst<Char, ElementType<N>> *absl::container_internal::internal_layout::LayoutImpl<std::tuple<absl::container_internal::btree_node<absl::container_internal::set_params<std::pair<int, int>, std::less<std::pair<int, int>>, std::allocator<std::pair<int, int>>, 256, false>> *, unsigned int, unsigned char, std::pair<int, int>, absl::container_internal::btree_node<absl::container_internal::set_params<std::pair<int, int>, std::less<std::pair<int, int>>, std::allocator<std::pair<int, int>>, 256, false>> *>, std::integer_sequence<unsigned long, 1, 0, 4, 30, 31>, std::integer_sequence<unsigned long>, std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>, std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>>::Pointer(Char *) const [Elements = std::tuple<absl::container_internal::btree_node<absl::container_internal::set_params<std::pair<int, int>, std::less<std::pair<int, int>>, std::allocator<std::pair<int, int>>, 256, false>> *, unsigned int, unsigned char, std::pair<int, int>, absl::container_internal::btree_node<absl::container_internal::set_params<std::pair<int, int>, std::less<std::pair<int, int>>, std::allocator<std::pair<int, int>>, 256, false>> *>, StaticSizeSeq = std::integer_sequence<unsigned long, 1, 0, 4, 30, 31>, RuntimeSizeSeq = std::integer_sequence<unsigned long>, SizeSeq = std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>, OffsetSeq = std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>, N = 2UL, Char = const char]"
               );
}

Assistant:

void CommandLineInterface::PrintFreeFieldNumbers(const Descriptor* descriptor) {
  absl::btree_set<FieldRange> ranges;
  std::vector<const Descriptor*> nested_messages;
  GatherOccupiedFieldRanges(descriptor, &ranges, &nested_messages);

  for (size_t i = 0; i < nested_messages.size(); ++i) {
    PrintFreeFieldNumbers(nested_messages[i]);
  }
  FormatFreeFieldNumbers(descriptor->full_name(), ranges);
}